

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboApiTest.cpp
# Opt level: O2

void deqp::gles2::Functional::deleteTexCubeAttachedToBoundFboTest(TestContext *testCtx,Context *ctx)

{
  undefined4 in_EAX;
  undefined4 uStack_28;
  deUint32 texCube;
  
  uStack_28 = in_EAX;
  (*ctx->_vptr_Context[9])(ctx,0x8d40,1);
  _uStack_28 = CONCAT44(1,uStack_28);
  (*ctx->_vptr_Context[6])(ctx,0x8513,1);
  (*ctx->_vptr_Context[0x1e])(ctx,0x8d40,0x8d00,0x8515,1,0,_uStack_28);
  checkFboAttachmentParam(testCtx,ctx,0x8d00,0x8cd0,0x1702);
  checkFboAttachmentParam(testCtx,ctx,0x8d00,0x8cd1,1);
  (*ctx->_vptr_Context[8])(ctx,1,&texCube);
  checkFboAttachmentParam(testCtx,ctx,0x8d00,0x8cd0,0);
  return;
}

Assistant:

static void deleteTexCubeAttachedToBoundFboTest (tcu::TestContext& testCtx, sglr::Context& ctx)
{
	ctx.bindFramebuffer(GL_FRAMEBUFFER, 1);

	deUint32 texCube = 1;
	ctx.bindTexture(GL_TEXTURE_CUBE_MAP, texCube);
	ctx.framebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_TEXTURE_CUBE_MAP_POSITIVE_X, texCube, 0);

	checkFboAttachmentParam(testCtx, ctx, GL_DEPTH_ATTACHMENT, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE, GL_TEXTURE);
	checkFboAttachmentParam(testCtx, ctx, GL_DEPTH_ATTACHMENT, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_NAME, texCube);

	ctx.deleteTextures(1, &texCube);

	checkFboAttachmentParam(testCtx, ctx, GL_DEPTH_ATTACHMENT, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE, GL_NONE);
}